

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

int mbedtls_des3_crypt_ecb(mbedtls_des3_context *ctx,uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar3 = *(uint *)input;
  uVar2 = *(uint *)(input + 4);
  uVar1 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = (uVar1 >> 4 ^ uVar2) & 0xf0f0f0f;
  uVar2 = uVar2 ^ uVar3;
  uVar1 = uVar3 << 4 ^ uVar1;
  uVar3 = uVar2 & 0xffff ^ uVar1 >> 0x10;
  uVar2 = uVar2 ^ uVar3;
  uVar1 = uVar3 << 0x10 ^ uVar1;
  uVar3 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 2 ^ uVar2;
  uVar3 = (uVar2 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 8 ^ uVar2;
  uVar2 = uVar2 << 1 | (uint)((int)uVar2 < 0);
  uVar3 = (uVar2 ^ uVar1) & 0xaaaaaaaa;
  uVar2 = uVar2 ^ uVar3;
  uVar3 = uVar3 ^ uVar1;
  uVar3 = uVar3 << 1 | (uint)((int)uVar3 < 0);
  lVar5 = 0;
  do {
    uVar4 = *(uint *)((long)ctx->sk + lVar5) ^ uVar2;
    uVar1 = (uVar2 << 0x1c | uVar2 >> 4) ^ *(uint *)((long)ctx->sk + lVar5 + 4);
    uVar3 = uVar3 ^ SB8[uVar4 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar4 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar4 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar4 >> 0x16 & 0xfc)) ^ SB7[uVar1 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar1 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar1 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar1 >> 0x16 & 0xfc));
    uVar1 = *(uint *)((long)ctx->sk + lVar5 + 8) ^ uVar3;
    uVar4 = (uVar3 << 0x1c | uVar3 >> 4) ^ *(uint *)((long)ctx->sk + lVar5 + 0xc);
    uVar2 = SB8[uVar1 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar1 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar1 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar1 >> 0x16 & 0xfc)) ^ SB7[uVar4 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar4 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar4 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar4 >> 0x16 & 0xfc)) ^ uVar2;
    lVar5 = lVar5 + 0x10;
  } while ((int)lVar5 != 0x80);
  lVar5 = 0;
  do {
    uVar4 = *(uint *)((long)ctx->sk + lVar5 + 0x80) ^ uVar3;
    uVar1 = (uVar3 << 0x1c | uVar3 >> 4) ^ *(uint *)((long)ctx->sk + lVar5 + 0x84);
    uVar2 = uVar2 ^ SB8[uVar4 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar4 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar4 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar4 >> 0x16 & 0xfc)) ^ SB7[uVar1 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar1 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar1 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar1 >> 0x16 & 0xfc));
    uVar1 = *(uint *)((long)ctx->sk + lVar5 + 0x88) ^ uVar2;
    uVar4 = (uVar2 << 0x1c | uVar2 >> 4) ^ *(uint *)((long)ctx->sk + lVar5 + 0x8c);
    uVar3 = SB8[uVar1 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar1 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar1 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar1 >> 0x16 & 0xfc)) ^ SB7[uVar4 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar4 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar4 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar4 >> 0x16 & 0xfc)) ^ uVar3;
    lVar5 = lVar5 + 0x10;
  } while ((int)lVar5 != 0x80);
  lVar5 = 0;
  do {
    uVar4 = *(uint *)((long)ctx->sk + lVar5 + 0x100) ^ uVar2;
    uVar1 = (uVar2 << 0x1c | uVar2 >> 4) ^ *(uint *)((long)ctx->sk + lVar5 + 0x104);
    uVar3 = uVar3 ^ SB8[uVar4 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar4 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar4 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar4 >> 0x16 & 0xfc)) ^ SB7[uVar1 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar1 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar1 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar1 >> 0x16 & 0xfc));
    uVar1 = *(uint *)((long)ctx->sk + lVar5 + 0x108) ^ uVar3;
    uVar4 = (uVar3 << 0x1c | uVar3 >> 4) ^ *(uint *)((long)ctx->sk + lVar5 + 0x10c);
    uVar2 = SB8[uVar1 & 0x3f] ^ *(uint *)((long)SB6 + (ulong)(uVar1 >> 6 & 0xfc)) ^
            *(uint *)((long)SB4 + (ulong)(uVar1 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB2 + (ulong)(uVar1 >> 0x16 & 0xfc)) ^ SB7[uVar4 & 0x3f] ^
            *(uint *)((long)SB5 + (ulong)(uVar4 >> 6 & 0xfc)) ^
            *(uint *)((long)SB3 + (ulong)(uVar4 >> 0xe & 0xfc)) ^
            *(uint *)((long)SB1 + (ulong)(uVar4 >> 0x16 & 0xfc)) ^ uVar2;
    lVar5 = lVar5 + 0x10;
  } while ((int)lVar5 != 0x80);
  uVar1 = uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f;
  uVar2 = (uVar1 ^ uVar3) & 0xaaaaaaaa;
  uVar1 = uVar1 ^ uVar2;
  uVar2 = uVar2 ^ uVar3;
  uVar2 = uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f;
  uVar3 = (uVar2 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 8 ^ uVar2;
  uVar3 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
  uVar1 = uVar1 ^ uVar3;
  uVar2 = uVar3 << 2 ^ uVar2;
  uVar3 = uVar2 & 0xffff ^ uVar1 >> 0x10;
  uVar2 = uVar2 ^ uVar3;
  uVar1 = uVar3 << 0x10 ^ uVar1;
  uVar3 = (uVar1 >> 4 ^ uVar2) & 0xf0f0f0f;
  uVar2 = uVar2 ^ uVar3;
  uVar1 = uVar3 << 4 ^ uVar1;
  *output = (uchar)(uVar1 >> 0x18);
  output[1] = (uchar)(uVar1 >> 0x10);
  output[2] = (uchar)(uVar1 >> 8);
  output[3] = (uchar)uVar1;
  output[4] = (uchar)(uVar2 >> 0x18);
  output[5] = (uchar)(uVar2 >> 0x10);
  output[6] = (uchar)(uVar2 >> 8);
  output[7] = (uchar)uVar2;
  return 0;
}

Assistant:

int mbedtls_des3_crypt_ecb( mbedtls_des3_context *ctx,
                     const unsigned char input[8],
                     unsigned char output[8] )
{
    int i;
    uint32_t X, Y, T, *SK;

    SK = ctx->sk;

    GET_UINT32_BE( X, input, 0 );
    GET_UINT32_BE( Y, input, 4 );

    DES_IP( X, Y );

    for( i = 0; i < 8; i++ )
    {
        DES_ROUND( Y, X );
        DES_ROUND( X, Y );
    }

    for( i = 0; i < 8; i++ )
    {
        DES_ROUND( X, Y );
        DES_ROUND( Y, X );
    }

    for( i = 0; i < 8; i++ )
    {
        DES_ROUND( Y, X );
        DES_ROUND( X, Y );
    }

    DES_FP( Y, X );

    PUT_UINT32_BE( Y, output, 0 );
    PUT_UINT32_BE( X, output, 4 );

    return( 0 );
}